

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O0

FuncInfo *
PreVisitFunction(ParseNodeFnc *pnodeFnc,ByteCodeGenerator *byteCodeGenerator,
                ParseableFunctionInfo *reuseNestedFunc)

{
  code *pcVar1;
  FuncInfo *this;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  ByteCodeGenerator *pBVar5;
  size_t sVar6;
  undefined4 *puVar7;
  Scope *this_00;
  FunctionBody *pFVar8;
  bool local_82;
  bool local_81;
  bool local_7a;
  bool assignLocationForFormals;
  FunctionBody *parentFunctionBody;
  bool doStackArgsOpt;
  ArgSlot local_5a;
  FuncInfo *pFStack_58;
  ArgSlot pos;
  FuncInfo *funcInfo;
  uint local_48;
  uint32 uStack_44;
  bool funcExprWithName;
  uint functionNameOffset;
  uint funcNameLength;
  char16 *funcName;
  FuncInfo *pFStack_30;
  bool fIsRoot;
  FuncInfo *parentFunc;
  ParseableFunctionInfo *reuseNestedFunc_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  ParseNodeFnc *pnodeFnc_local;
  
  parentFunc = (FuncInfo *)reuseNestedFunc;
  reuseNestedFunc_local = (ParseableFunctionInfo *)byteCodeGenerator;
  byteCodeGenerator_local = (ByteCodeGenerator *)pnodeFnc;
  pFStack_30 = ByteCodeGenerator::TopFuncInfo(byteCodeGenerator);
  uVar3 = ByteCodeGenerator::GetFlags((ByteCodeGenerator *)reuseNestedFunc_local);
  local_7a = false;
  if ((uVar3 & 0x1000) == 0) {
    bVar2 = FuncInfo::IsGlobalFunction(pFStack_30);
    local_7a = false;
    if (bVar2) {
      pBVar5 = (ByteCodeGenerator *)ParseNodeFnc::GetTopLevelScope(pFStack_30->root);
      local_7a = pBVar5 == byteCodeGenerator_local;
    }
  }
  funcName._7_1_ = local_7a;
  _functionNameOffset = L"Anonymous function";
  uStack_44 = 0x12;
  local_48 = 0;
  funcInfo._7_1_ = 0;
  if (byteCodeGenerator_local->currentTopStatement != (ParseNode *)0x0) {
    _functionNameOffset = (char16 *)byteCodeGenerator_local->currentTopStatement;
    uStack_44 = *(uint32 *)&byteCodeGenerator_local->currentScope;
    local_48 = *(uint *)((long)&byteCodeGenerator_local->currentScope + 4);
    if ((uStack_44 == 0) && (sVar6 = PAL_wcslen(_functionNameOffset), (int)sVar6 != 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x9b3,
                         "(funcNameLength != 0 || funcNameLength == (int)PAL_wcslen(funcName))",
                         "funcNameLength != 0 || funcNameLength == (int)wcslen(funcName)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
  }
  bVar2 = ParseNodeFnc::IsDeclaration((ParseNodeFnc *)byteCodeGenerator_local);
  if ((bVar2) || (bVar2 = ParseNodeFnc::IsMethod((ParseNodeFnc *)byteCodeGenerator_local), bVar2)) {
    if ((byteCodeGenerator_local->currentBlock != (ParseNodeBlock *)0x0) &&
       (bVar2 = ParseNodeFnc::IsClassMember((ParseNodeFnc *)byteCodeGenerator_local), !bVar2)) {
      _functionNameOffset = Ident::Psz((Ident *)byteCodeGenerator_local->currentBlock);
      uStack_44 = Ident::Cch((Ident *)byteCodeGenerator_local->currentBlock);
      local_48 = 0;
    }
  }
  else if (byteCodeGenerator_local->funcInfoStack ==
           (SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    bVar2 = ParseNodeFnc::IsModule((ParseNodeFnc *)byteCodeGenerator_local);
    if (bVar2) {
      _functionNameOffset = L"Module code";
      uStack_44 = 0xb;
      local_48 = 0;
    }
  }
  else {
    if (*(char *)&(byteCodeGenerator_local->funcInfoStack->
                  super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
                  super_SListNodeBase<Memory::ArenaAllocator>.next != 'Q') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x9c1,"(pnodeFnc->pnodeName->nop == knopVarDecl)",
                         "pnodeFnc->pnodeName->nop == knopVarDecl");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar7 = 0;
    }
    _functionNameOffset =
         Ident::Psz((Ident *)byteCodeGenerator_local->funcInfoStack[1].
                             super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>.
                             super_SListNodeBase<Memory::ArenaAllocator>.next);
    uStack_44 = Ident::Cch((Ident *)byteCodeGenerator_local->funcInfoStack[1].
                                    super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>.
                                    super_SListNodeBase<Memory::ArenaAllocator>.next);
    local_48 = 0;
    funcInfo._7_1_ = 1;
  }
  bVar2 = ByteCodeGenerator::Trace((ByteCodeGenerator *)reuseNestedFunc_local);
  if (bVar2) {
    Output::Print(L"function start %s\n",_functionNameOffset);
  }
  if (*(long *)&(byteCodeGenerator_local->m_writer).nextBranchIslandOffset != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x9d6,"(pnodeFnc->funcInfo == nullptr)","pnodeFnc->funcInfo == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pFStack_58 = ByteCodeGenerator::StartBindFunction
                         ((ByteCodeGenerator *)reuseNestedFunc_local,_functionNameOffset,uStack_44,
                          local_48,(bool *)((long)&funcInfo + 7),
                          (ParseNodeFnc *)byteCodeGenerator_local,
                          (ParseableFunctionInfo *)parentFunc);
  *(FuncInfo **)&(byteCodeGenerator_local->m_writer).nextBranchIslandOffset = pFStack_58;
  Js::ParseableFunctionInfo::SetIsNamedFunctionExpression
            (pFStack_58->byteCodeFunction,(bool)(funcInfo._7_1_ & 1));
  Js::ParseableFunctionInfo::SetIsNameIdentifierRef
            (pFStack_58->byteCodeFunction,
             (bool)(*(byte *)((long)&(byteCodeGenerator_local->m_writer).m_byteCodeData.
                                     currentOffset + 2) & 1));
  if ((funcName._7_1_ & 1) != 0) {
    ByteCodeGenerator::SetRootFuncInfo((ByteCodeGenerator *)reuseNestedFunc_local,pFStack_58);
  }
  if ((byteCodeGenerator_local->m_writer).m_longJumpOffsets ==
      (List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    local_5a = 1;
    MapFormalsWithoutRest<PreVisitFunction(ParseNodeFnc*,ByteCodeGenerator*,Js::ParseableFunctionInfo*)::__0>
              ((ParseNodeFnc *)byteCodeGenerator_local,(anon_class_8_1_ba1d6db4)&local_5a);
    ByteCodeGenerator::SetNumberOfInArgs((ByteCodeGenerator *)reuseNestedFunc_local,local_5a);
    pnodeFnc_local = (ParseNodeFnc *)pFStack_58;
  }
  else {
    bVar2 = ParseNodeFnc::HasReferenceableBuiltInArguments((ParseNodeFnc *)byteCodeGenerator_local);
    if (bVar2) {
      bVar2 = ParseNodeFnc::CallsEval((ParseNodeFnc *)byteCodeGenerator_local);
      if (bVar2) {
        FuncInfo::SetHasArguments(pFStack_58,true);
        FuncInfo::SetHasHeapArguments(pFStack_58,true,false);
        if (pFStack_58->inArgsCount == 0) {
          ByteCodeGenerator::AssignNullConstRegister((ByteCodeGenerator *)reuseNestedFunc_local);
        }
      }
      else {
        bVar2 = ParseNodeFnc::UsesArguments((ParseNodeFnc *)byteCodeGenerator_local);
        if (bVar2) {
          FuncInfo::SetHasArguments(pFStack_58,true);
          pFVar8 = FuncInfo::GetParsedFunctionBody(pFStack_58);
          Js::ParseableFunctionInfo::SetUsesArgumentsObject
                    (&pFVar8->super_ParseableFunctionInfo,true);
          bVar2 = ParseNodeFnc::HasHeapArguments((ParseNodeFnc *)byteCodeGenerator_local);
          if (bVar2) {
            bVar2 = ParseNodeFnc::HasAnyWriteToFormals((ParseNodeFnc *)byteCodeGenerator_local);
            local_81 = true;
            if (bVar2) {
              local_81 = FuncInfo::GetIsStrictMode(pFStack_58);
            }
            parentFunctionBody._7_1_ = local_81;
            bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,PerfHintPhase);
            if ((bVar2) && (local_81 == false)) {
              pFVar8 = FuncInfo::GetParsedFunctionBody(pFStack_58);
              WritePerfHint(HeapArgumentsDueToWriteToFormals,pFVar8,0);
            }
            if (local_81 != false) {
              this_00 = FuncInfo::GetParamScope
                                  (*(FuncInfo **)
                                    &(byteCodeGenerator_local->m_writer).nextBranchIslandOffset);
              iVar4 = Scope::Count(this_00);
              if ((1 < iVar4) &&
                 ((((uVar3 = ByteCodeGenerator::GetFlags((ByteCodeGenerator *)reuseNestedFunc_local)
                    , (uVar3 & 0x400) != 0 ||
                    (bVar2 = ParseNodeFnc::HasWithStmt((ParseNodeFnc *)byteCodeGenerator_local),
                    bVar2)) ||
                   (bVar2 = ByteCodeGenerator::IsInDebugMode
                                      ((ByteCodeGenerator *)reuseNestedFunc_local), bVar2)) ||
                  ((bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,StackArgFormalsOptPhase),
                   bVar2 || (bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,StackArgOptPhase)
                            , bVar2)))))) {
                parentFunctionBody._7_1_ = false;
                bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,PerfHintPhase);
                if (bVar2) {
                  bVar2 = ParseNodeFnc::HasWithStmt((ParseNodeFnc *)byteCodeGenerator_local);
                  if (bVar2) {
                    pFVar8 = FuncInfo::GetParsedFunctionBody(pFStack_58);
                    WritePerfHint(HasWithBlock,pFVar8,0);
                  }
                  uVar3 = ByteCodeGenerator::GetFlags((ByteCodeGenerator *)reuseNestedFunc_local);
                  if ((uVar3 & 0x400) != 0) {
                    pFVar8 = FuncInfo::GetParsedFunctionBody(pFStack_58);
                    WritePerfHint(SrcIsEval,pFVar8,0);
                  }
                }
              }
            }
            this = pFStack_58;
            bVar2 = ParseNodeFnc::IsCoroutine((ParseNodeFnc *)byteCodeGenerator_local);
            local_82 = false;
            if (!bVar2) {
              local_82 = parentFunctionBody._7_1_;
            }
            FuncInfo::SetHasHeapArguments(this,true,local_82);
            if (pFStack_58->inArgsCount == 0) {
              ByteCodeGenerator::AssignNullConstRegister((ByteCodeGenerator *)reuseNestedFunc_local)
              ;
            }
          }
        }
      }
    }
    pFVar8 = FuncInfo::GetParsedFunctionBody(pFStack_30);
    bVar2 = FuncInfo::GetHasArguments(pFStack_58);
    if ((bVar2) ||
       (bVar2 = Js::ParseableFunctionInfo::GetHasOrParentHasArguments
                          (&pFVar8->super_ParseableFunctionInfo), bVar2)) {
      pFVar8 = FuncInfo::GetParsedFunctionBody(pFStack_58);
      Js::ParseableFunctionInfo::SetHasOrParentHasArguments
                (&pFVar8->super_ParseableFunctionInfo,true);
    }
    PreVisitBlock((ParseNodeBlock *)byteCodeGenerator_local->globalScope,
                  (ByteCodeGenerator *)reuseNestedFunc_local);
    bVar2 = ByteCodeGenerator::NeedScopeObjectForArguments
                      ((ByteCodeGenerator *)reuseNestedFunc_local,pFStack_58,pFStack_58->root);
    AddArgsToScope((ParseNodeFnc *)byteCodeGenerator_local,
                   (ByteCodeGenerator *)reuseNestedFunc_local,(bool)((bVar2 ^ 0xffU) & 1));
    pnodeFnc_local = (ParseNodeFnc *)pFStack_58;
  }
  return (FuncInfo *)pnodeFnc_local;
}

Assistant:

FuncInfo* PreVisitFunction(ParseNodeFnc* pnodeFnc, ByteCodeGenerator* byteCodeGenerator, Js::ParseableFunctionInfo *reuseNestedFunc)
{
    // Do binding of function name(s), initialize function scope, propagate function-wide properties from
    // the parent (if any).
    FuncInfo* parentFunc = byteCodeGenerator->TopFuncInfo();

    // fIsRoot indicates that this is the root function to be returned to a ParseProcedureText/AddScriptLet/etc. call.
    // In such cases, the global function is just a wrapper around the root function's declaration.
    // We used to assert that this was the only top-level function body, but it's possible to trick
    // "new Function" into compiling more than one function (see WOOB 1121759).
    bool fIsRoot = (!(byteCodeGenerator->GetFlags() & fscrGlobalCode) &&
        parentFunc->IsGlobalFunction() &&
        parentFunc->root->GetTopLevelScope() == pnodeFnc);

    const char16 *funcName = Js::Constants::AnonymousFunction;
    uint funcNameLength = Js::Constants::AnonymousFunctionLength;
    uint functionNameOffset = 0;
    bool funcExprWithName = false;

    if (pnodeFnc->hint != nullptr)
    {
        funcName = reinterpret_cast<const char16*>(pnodeFnc->hint);
        funcNameLength = pnodeFnc->hintLength;
        functionNameOffset = pnodeFnc->hintOffset;
        Assert(funcNameLength != 0 || funcNameLength == (int)wcslen(funcName));
    }
    if (pnodeFnc->IsDeclaration() || pnodeFnc->IsMethod())
    {
        // Class members have the fully qualified name stored in 'hint', no need to replace it.
        if (pnodeFnc->pid && !pnodeFnc->IsClassMember())
        {
            funcName = reinterpret_cast<const char16*>(pnodeFnc->pid->Psz());
            funcNameLength = pnodeFnc->pid->Cch();
            functionNameOffset = 0;
        }
    }
    else if (pnodeFnc->pnodeName != nullptr)
    {
        Assert(pnodeFnc->pnodeName->nop == knopVarDecl);
        funcName = reinterpret_cast<const char16*>(pnodeFnc->pnodeName->pid->Psz());
        funcNameLength = pnodeFnc->pnodeName->pid->Cch();
        functionNameOffset = 0;
        //
        // create the new scope for Function expression only in ES5 mode
        //
        funcExprWithName = true;
    }
    else if (pnodeFnc->IsModule())
    {
        funcName = Js::Constants::ModuleCode;
        funcNameLength = Js::Constants::ModuleCodeLength;
        functionNameOffset = 0;
    }

    if (byteCodeGenerator->Trace())
    {
        Output::Print(_u("function start %s\n"), funcName);
    }

    Assert(pnodeFnc->funcInfo == nullptr);
    FuncInfo* funcInfo = pnodeFnc->funcInfo = byteCodeGenerator->StartBindFunction(funcName, funcNameLength, functionNameOffset, &funcExprWithName, pnodeFnc, reuseNestedFunc);
    funcInfo->byteCodeFunction->SetIsNamedFunctionExpression(funcExprWithName);
    funcInfo->byteCodeFunction->SetIsNameIdentifierRef(pnodeFnc->isNameIdentifierRef);

    if (fIsRoot)
    {
        byteCodeGenerator->SetRootFuncInfo(funcInfo);
    }

    if (pnodeFnc->pnodeBody == nullptr)
    {
        // This is a deferred byte code gen, so we're done.
        // Process the formal arguments, even if there's no AST for the body, to support Function.length.
        Js::ArgSlot pos = 1;
        // We skip the rest parameter here because it is not counted towards the in arg count.
        MapFormalsWithoutRest(pnodeFnc, [&](ParseNode *pnode) { ArgSlotMath::Inc(pos); });
        byteCodeGenerator->SetNumberOfInArgs(pos);
        return funcInfo;
    }

    if (pnodeFnc->HasReferenceableBuiltInArguments())
    {
        // The parser identified that there is a way to reference the built-in 'arguments' variable from this function. So, we
        // need to determine whether we need to create the variable or not. We need to create the variable iff:
        if (pnodeFnc->CallsEval())
        {
            // 1. eval is called.
            // 2. when the debugging is enabled, since user can seek arguments during breakpoint.
            funcInfo->SetHasArguments(true);
            funcInfo->SetHasHeapArguments(true);
            if (funcInfo->inArgsCount == 0)
            {
                // If no formals to function, no need to create the propertyid array
                byteCodeGenerator->AssignNullConstRegister();
            }
        }
        else if (pnodeFnc->UsesArguments())
        {
            // 3. the function directly references an 'arguments' identifier
            funcInfo->SetHasArguments(true);
            funcInfo->GetParsedFunctionBody()->SetUsesArgumentsObject(true);
            if (pnodeFnc->HasHeapArguments())
            {
                bool doStackArgsOpt = (!pnodeFnc->HasAnyWriteToFormals() || funcInfo->GetIsStrictMode());
#ifdef PERF_HINT
                if (PHASE_TRACE1(Js::PerfHintPhase) && !doStackArgsOpt)
                {
                    WritePerfHint(PerfHints::HeapArgumentsDueToWriteToFormals, funcInfo->GetParsedFunctionBody(), 0);
                }
#endif

                //With statements - need scope object to be present.
                if ((doStackArgsOpt && pnodeFnc->funcInfo->GetParamScope()->Count() > 1) && ((byteCodeGenerator->GetFlags() & fscrEval) ||
                    pnodeFnc->HasWithStmt() || byteCodeGenerator->IsInDebugMode() || PHASE_OFF1(Js::StackArgFormalsOptPhase) || PHASE_OFF1(Js::StackArgOptPhase)))
                {
                    doStackArgsOpt = false;
#ifdef PERF_HINT
                    if (PHASE_TRACE1(Js::PerfHintPhase))
                    {
                        if (pnodeFnc->HasWithStmt())
                        {
                            WritePerfHint(PerfHints::HasWithBlock, funcInfo->GetParsedFunctionBody(), 0);
                        }

                        if(byteCodeGenerator->GetFlags() & fscrEval)
                        {
                            WritePerfHint(PerfHints::SrcIsEval, funcInfo->GetParsedFunctionBody(), 0);
                        }
                    }
#endif
                }
                funcInfo->SetHasHeapArguments(true, !pnodeFnc->IsCoroutine() && doStackArgsOpt /*= Optimize arguments in backend*/);
                if (funcInfo->inArgsCount == 0)
                {
                    // If no formals to function, no need to create the propertyid array
                    byteCodeGenerator->AssignNullConstRegister();
                }
            }
        }
    }

    Js::FunctionBody* parentFunctionBody = parentFunc->GetParsedFunctionBody();
    if (funcInfo->GetHasArguments() ||
        parentFunctionBody->GetHasOrParentHasArguments())
    {
        // The JIT uses this info, for instance, to narrow kills of array operations
        funcInfo->GetParsedFunctionBody()->SetHasOrParentHasArguments(true);
    }
    PreVisitBlock(pnodeFnc->pnodeScopes, byteCodeGenerator);
    // If we have arguments, we are going to need locations if the function is in strict mode or we have a non-simple parameter list. This is because we will not create a scope object.
    bool assignLocationForFormals = !byteCodeGenerator->NeedScopeObjectForArguments(funcInfo, funcInfo->root);
    AddArgsToScope(pnodeFnc, byteCodeGenerator, assignLocationForFormals);

    return funcInfo;
}